

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<int,QHashDummyValue>::emplace<QHashDummyValue_const&>
          (QHash<int,QHashDummyValue> *this,int *key,QHashDummyValue *args)

{
  Data *pDVar1;
  Data<QHashPrivate::Node<int,_QHashDummyValue>_> *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QHash<int,_QHashDummyValue> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
LAB_0049049a:
    pDVar2 = *(Data<QHashPrivate::Node<int,_QHashDummyValue>_> **)this;
    local_28.d = pDVar1;
    if ((pDVar2 == (Data<QHashPrivate::Node<int,_QHashDummyValue>_> *)0x0) ||
       (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar2 = QHashPrivate::Data<QHashPrivate::Node<int,_QHashDummyValue>_>::detached(pDVar2);
      *(Data<QHashPrivate::Node<int,_QHashDummyValue>_> **)this = pDVar2;
    }
    pVar3 = (piter)emplace_helper<QHashDummyValue_const&>(this,key,args);
    QHash<int,_QHashDummyValue>::~QHash(&local_28);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      if ((pDVar1 != (Data *)0x0) &&
         ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_0049049a;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar3 = (piter)emplace_helper<QHashDummyValue_const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_0049052a;
    }
    pVar3 = (piter)QHash<int,_QHashDummyValue>::emplace_helper<QHashDummyValue>
                             ((QHash<int,_QHashDummyValue> *)this,key,(QHashDummyValue *)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_0049052a:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }